

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

_binbuf * glist_writetobinbuf(_glist *x,int wholething)

{
  int iVar1;
  _binbuf *x_00;
  t_symbol *ptVar2;
  t_template *ptVar3;
  t_symbol *ptVar4;
  t_symbol *local_50;
  t_symbol *type;
  int m;
  int j;
  t_template *template;
  _binbuf *b;
  t_gobj *y;
  t_symbol **pptStack_20;
  int ntemplates;
  t_symbol **templatevec;
  int i;
  int wholething_local;
  _glist *x_local;
  
  templatevec._4_4_ = wholething;
  _i = x;
  pptStack_20 = (t_symbol **)getbytes(0);
  y._4_4_ = 0;
  x_00 = binbuf_new();
  for (b = (_binbuf *)_i->gl_list; b != (_binbuf *)0x0; b = (_binbuf *)b->b_vec) {
    if ((*(_class **)b == scalar_class) &&
       ((templatevec._4_4_ != 0 || (iVar1 = glist_isselected(_i,(t_gobj *)b), iVar1 != 0)))) {
      canvas_addtemplatesforscalar
                (*(t_symbol **)(b + 1),(t_word *)&b[1].b_vec,(int *)((long)&y + 4),
                 &stack0xffffffffffffffe0);
    }
  }
  ptVar2 = gensym("data");
  binbuf_addv(x_00,"s;",ptVar2);
  for (templatevec._0_4_ = 0; (int)templatevec < y._4_4_; templatevec._0_4_ = (int)templatevec + 1)
  {
    ptVar3 = template_findbyname(pptStack_20[(int)templatevec]);
    iVar1 = ptVar3->t_n;
    ptVar2 = gensym("template");
    ptVar4 = gensym(pptStack_20[(int)templatevec]->s_name + 3);
    binbuf_addv(x_00,"ss;",ptVar2,ptVar4);
    for (type._4_4_ = 0; type._4_4_ < iVar1; type._4_4_ = type._4_4_ + 1) {
      switch(ptVar3->t_vec[type._4_4_].ds_type) {
      case 0:
        local_50 = &s_float;
        break;
      case 1:
        local_50 = &s_symbol;
        break;
      case 2:
        local_50 = &s_list;
        break;
      case 3:
        local_50 = gensym("array");
        break;
      default:
        local_50 = &s_float;
        bug("canvas_write");
      }
      if (ptVar3->t_vec[type._4_4_].ds_type == 3) {
        ptVar2 = ptVar3->t_vec[type._4_4_].ds_name;
        ptVar4 = gensym((ptVar3->t_vec[type._4_4_].ds_arraytemplate)->s_name + 3);
        binbuf_addv(x_00,"sss;",local_50,ptVar2,ptVar4);
      }
      else {
        binbuf_addv(x_00,"ss;",local_50,ptVar3->t_vec[type._4_4_].ds_name);
      }
    }
    binbuf_addsemi(x_00);
  }
  binbuf_addsemi(x_00);
  for (b = (_binbuf *)_i->gl_list; b != (_binbuf *)0x0; b = (_binbuf *)b->b_vec) {
    if ((*(_class **)b == scalar_class) &&
       ((templatevec._4_4_ != 0 || (iVar1 = glist_isselected(_i,(t_gobj *)b), iVar1 != 0)))) {
      canvas_writescalar(*(t_symbol **)(b + 1),(t_word *)&b[1].b_vec,x_00,0);
    }
  }
  freebytes(pptStack_20,(long)y._4_4_ << 3);
  return x_00;
}

Assistant:

t_binbuf *glist_writetobinbuf(t_glist *x, int wholething)
{
    int i;
    t_symbol **templatevec = getbytes(0);
    int ntemplates = 0;
    t_gobj *y;
    t_binbuf *b = binbuf_new();

    for (y = x->gl_list; y; y = y->g_next)
    {
        if ((pd_class(&y->g_pd) == scalar_class) &&
            (wholething || glist_isselected(x, y)))
        {
            canvas_addtemplatesforscalar(((t_scalar *)y)->sc_template,
                ((t_scalar *)y)->sc_vec,  &ntemplates, &templatevec);
        }
    }
    binbuf_addv(b, "s;", gensym("data"));
    for (i = 0; i < ntemplates; i++)
    {
        t_template *template = template_findbyname(templatevec[i]);
        int j, m = template->t_n;
            /* drop "pd-" prefix from template symbol to print it: */
        binbuf_addv(b, "ss;", gensym("template"),
            gensym(templatevec[i]->s_name + 3));
        for (j = 0; j < m; j++)
        {
            t_symbol *type;
            switch (template->t_vec[j].ds_type)
            {
                case DT_FLOAT: type = &s_float; break;
                case DT_SYMBOL: type = &s_symbol; break;
                case DT_ARRAY: type = gensym("array"); break;
                case DT_TEXT: type = &s_list; break;
                default: type = &s_float; bug("canvas_write");
            }
            if (template->t_vec[j].ds_type == DT_ARRAY)
                binbuf_addv(b, "sss;", type, template->t_vec[j].ds_name,
                    gensym(template->t_vec[j].ds_arraytemplate->s_name + 3));
            else binbuf_addv(b, "ss;", type, template->t_vec[j].ds_name);
        }
        binbuf_addsemi(b);
    }
    binbuf_addsemi(b);
        /* now write out the objects themselves */
    for (y = x->gl_list; y; y = y->g_next)
    {
        if ((pd_class(&y->g_pd) == scalar_class) &&
            (wholething || glist_isselected(x, y)))
        {
            canvas_writescalar(((t_scalar *)y)->sc_template,
                ((t_scalar *)y)->sc_vec,  b, 0);
        }
    }
    t_freebytes(templatevec, ntemplates*sizeof(*templatevec));
    return (b);
}